

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcCostItem::~IfcCostItem(IfcCostItem *this)

{
  ~IfcCostItem((IfcCostItem *)&this[-1].super_IfcControl.super_IfcObject.field_0x28);
  return;
}

Assistant:

IfcCostItem() : Object("IfcCostItem") {}